

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O3

void Js::JavascriptLibrary::CheckRegisteredBuiltIns(Type *builtInFuncs,ScriptContext *scriptContext)

{
  code *pcVar1;
  BuiltinFunction BVar2;
  bool bVar3;
  undefined4 *puVar4;
  ulong uVar5;
  
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  uVar5 = 0;
  do {
    if (builtInFuncs[uVar5].ptr != (JavascriptFunction *)0x0) {
      BVar2 = GetBuiltInForFuncInfo((((builtInFuncs[uVar5].ptr)->functionInfo).ptr)->functionId);
      if (uVar5 != BVar2._value) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar4 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
                                    ,0xf32,
                                    "(!builtInFuncs[index] || (index == GetBuiltInForFuncInfo(builtInFuncs[index]->GetFunctionInfo()->GetLocalFunctionId())))"
                                    ,
                                    "!builtInFuncs[index] || (index == GetBuiltInForFuncInfo(builtInFuncs[index]->GetFunctionInfo()->GetLocalFunctionId()))"
                                   );
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar4 = 0;
      }
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != 0x47);
  return;
}

Assistant:

void JavascriptLibrary::CheckRegisteredBuiltIns(
        Field(JavascriptFunction*)* builtInFuncs, ScriptContext *scriptContext)
    {
        byte count = BuiltinFunction::Count;
        for (byte index = 0; index < count; index++)
        {
            Assert(!builtInFuncs[index] || (index == GetBuiltInForFuncInfo(builtInFuncs[index]->GetFunctionInfo()->GetLocalFunctionId())));
        }
    }